

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>const&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *args_2,
          ConfigRuleClauseSyntax *args_3,Token *args_4)

{
  Token instance;
  Token topModule;
  Token semi;
  InstanceConfigRuleSyntax *this_00;
  
  this_00 = (InstanceConfigRuleSyntax *)allocate(this,0x78,8);
  instance.kind = args->kind;
  instance._2_1_ = args->field_0x2;
  instance.numFlags.raw = (args->numFlags).raw;
  instance.rawLen = args->rawLen;
  instance.info = args->info;
  topModule.kind = args_1->kind;
  topModule._2_1_ = args_1->field_0x2;
  topModule.numFlags.raw = (args_1->numFlags).raw;
  topModule.rawLen = args_1->rawLen;
  topModule.info = args_1->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::InstanceConfigRuleSyntax::InstanceConfigRuleSyntax
            (this_00,instance,topModule,args_2,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }